

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btContinuousConvexCollision.cpp
# Opt level: O3

bool __thiscall
btContinuousConvexCollision::calcTimeOfImpact
          (btContinuousConvexCollision *this,btTransform *fromA,btTransform *toA,btTransform *fromB,
          btTransform *toB,CastResult *result)

{
  undefined8 uVar1;
  btIDebugDraw *pbVar2;
  btScalar abVar3 [2];
  btScalar abVar4 [2];
  _func_int **pp_Var5;
  ulong uVar6;
  undefined8 uVar7;
  uint uVar8;
  float extraout_XMM0_Da;
  float fVar9;
  float extraout_XMM0_Da_00;
  float fVar10;
  float fVar11;
  float fVar12;
  btScalar timeStep;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  btScalar bVar20;
  btVector3 c;
  btVector3 linVelA;
  btPointCollector pointCollector;
  btVector3 angVelB;
  btVector3 linVelB;
  btVector3 angVelA;
  btVector3 axis;
  btPointCollector pointCollector1;
  btScalar angle;
  btScalar local_168 [2];
  btScalar abStack_160 [2];
  btVector3 local_158;
  btPointCollector local_148;
  btVector3 local_118;
  btVector3 local_108;
  btVector3 local_f8;
  btTransform local_e8;
  btPointCollector local_a0;
  btTransform local_70;
  
  uVar7 = *(undefined8 *)(toA->m_origin).m_floats;
  uVar1 = *(undefined8 *)(fromA->m_origin).m_floats;
  fVar14 = (float)uVar7 - (float)uVar1;
  local_158.m_floats[1] = (float)((ulong)uVar7 >> 0x20) - (float)((ulong)uVar1 >> 0x20);
  local_158.m_floats[0] = fVar14;
  local_158.m_floats[2] = (toA->m_origin).m_floats[2] - (fromA->m_origin).m_floats[2];
  local_158.m_floats[3] = 0.0;
  btTransformUtil::calculateDiffAxisAngle(fromA,toA,(btVector3 *)&local_e8,(btScalar *)&local_70);
  fVar15 = local_70.m_basis.m_el[0].m_floats[0] * local_e8.m_basis.m_el[0].m_floats[0];
  fVar17 = local_70.m_basis.m_el[0].m_floats[0] * local_e8.m_basis.m_el[0].m_floats[1];
  fVar10 = local_70.m_basis.m_el[0].m_floats[0] * local_e8.m_basis.m_el[0].m_floats[2];
  local_f8.m_floats[1] = fVar17;
  local_f8.m_floats[0] = fVar15;
  local_f8.m_floats[2] = fVar10;
  local_f8.m_floats[3] = 0.0;
  uVar7 = *(undefined8 *)(toB->m_origin).m_floats;
  uVar1 = *(undefined8 *)(fromB->m_origin).m_floats;
  fVar11 = (float)uVar7 - (float)uVar1;
  fVar13 = (float)((ulong)uVar7 >> 0x20) - (float)((ulong)uVar1 >> 0x20);
  fVar16 = (toB->m_origin).m_floats[2] - (fromB->m_origin).m_floats[2];
  local_108.m_floats[1] = fVar13;
  local_108.m_floats[0] = fVar11;
  local_108.m_floats[2] = fVar16;
  local_108.m_floats[3] = 0.0;
  btTransformUtil::calculateDiffAxisAngle(fromB,toB,(btVector3 *)&local_e8,(btScalar *)&local_70);
  fVar18 = local_70.m_basis.m_el[0].m_floats[0] * local_e8.m_basis.m_el[0].m_floats[0];
  fVar19 = local_70.m_basis.m_el[0].m_floats[0] * local_e8.m_basis.m_el[0].m_floats[1];
  fVar12 = local_70.m_basis.m_el[0].m_floats[0] * local_e8.m_basis.m_el[0].m_floats[2];
  local_118.m_floats[1] = fVar19;
  local_118.m_floats[0] = fVar18;
  local_118.m_floats[2] = fVar12;
  local_118.m_floats[3] = 0.0;
  (*(this->m_convexA->super_btCollisionShape)._vptr_btCollisionShape[4])();
  fVar9 = 0.0;
  if (this->m_convexB1 != (btConvexShape *)0x0) {
    (*(this->m_convexB1->super_btCollisionShape)._vptr_btCollisionShape[4])();
    fVar9 = extraout_XMM0_Da_00;
  }
  fVar10 = SQRT(fVar10 * fVar10 + fVar15 * fVar15 + fVar17 * fVar17) * extraout_XMM0_Da +
           SQRT(fVar12 * fVar12 + fVar18 * fVar18 + fVar19 * fVar19) * fVar9;
  fVar11 = fVar11 - fVar14;
  fVar13 = fVar13 - local_158.m_floats[1];
  fVar16 = fVar16 - local_158.m_floats[2];
  fVar9 = SQRT(fVar16 * fVar16 + fVar11 * fVar11 + fVar13 * fVar13) + fVar10;
  if ((fVar9 != 0.0) || (NAN(fVar9))) {
    local_a0.super_Result._vptr_Result = (_func_int **)&PTR__Result_0021fb40;
    local_a0.m_distance = 1e+18;
    local_a0.m_hasResult = false;
    computeClosestPoints(this,fromA,fromB,&local_a0);
    local_168[0] = local_a0.m_pointInWorld.m_floats[0];
    local_168[1] = local_a0.m_pointInWorld.m_floats[1];
    abStack_160[0] = local_a0.m_pointInWorld.m_floats[2];
    abStack_160[1] = local_a0.m_pointInWorld.m_floats[3];
    if (local_a0.m_hasResult == true) {
      fVar9 = local_a0.m_normalOnBInWorld.m_floats[0];
      fVar12 = local_a0.m_normalOnBInWorld.m_floats[1];
      if (1.1920929e-07 <
          fVar16 * local_a0.m_normalOnBInWorld.m_floats[2] + fVar11 * fVar9 + fVar12 * fVar13 +
          fVar10) {
        fVar14 = local_a0.m_distance + result->m_allowedPenetration;
        if (fVar14 <= 0.001) {
          timeStep = 0.0;
          local_148.m_normalOnBInWorld.m_floats[0] = fVar9;
          local_148.m_normalOnBInWorld.m_floats[1] = fVar12;
        }
        else {
          uVar8 = 0;
          bVar20 = local_a0.m_normalOnBInWorld.m_floats[2];
          fVar15 = 0.0;
          abVar3 = local_168;
          abVar4 = abStack_160;
          do {
            abStack_160 = abVar4;
            local_168 = abVar3;
            pbVar2 = result->m_debugDrawer;
            if (pbVar2 != (btIDebugDraw *)0x0) {
              local_e8.m_basis.m_el[0].m_floats[0] = 1.0;
              local_e8.m_basis.m_el[0].m_floats[1] = 1.0;
              local_e8.m_basis.m_el[0].m_floats[2] = 1.0;
              local_e8.m_basis.m_el[0].m_floats[3] = 0.0;
              (*pbVar2->_vptr_btIDebugDraw[7])(0x3e4ccccd,pbVar2,local_168,&local_e8);
            }
            fVar9 = bVar20 * fVar16 + fVar12 * fVar13 + fVar11 * fVar9 + fVar10;
            if (fVar9 <= 1.1920929e-07) {
              return false;
            }
            timeStep = fVar14 / fVar9 + fVar15;
            if (timeStep <= fVar15) {
              return false;
            }
            if (1.0 < timeStep) {
              return false;
            }
            if (timeStep < 0.0) {
              return false;
            }
            btTransformUtil::integrateTransform(fromA,&local_158,&local_f8,timeStep,&local_e8);
            btTransformUtil::integrateTransform(fromB,&local_108,&local_118,timeStep,&local_70);
            pbVar2 = result->m_debugDrawer;
            if (pbVar2 != (btIDebugDraw *)0x0) {
              local_148.super_Result._vptr_Result = (_func_int **)0x3f800000;
              local_148.m_normalOnBInWorld.m_floats[0] = 0.0;
              local_148.m_normalOnBInWorld.m_floats[1] = 0.0;
              (*pbVar2->_vptr_btIDebugDraw[7])(0x3e4ccccd,pbVar2,&local_e8.m_origin,&local_148);
            }
            (**result->_vptr_CastResult)(timeStep,result);
            local_148.super_Result._vptr_Result = (_func_int **)&PTR__Result_0021fb40;
            local_148.m_distance = 1e+18;
            local_148.m_hasResult = false;
            computeClosestPoints(this,&local_e8,&local_70,&local_148);
            if (local_148.m_hasResult != true) {
              pp_Var5 = result->_vptr_CastResult;
              uVar7 = 0xffffffff;
              uVar6 = (ulong)uVar8;
LAB_00178e60:
              (*pp_Var5[2])(result,uVar7,uVar6);
              return false;
            }
            abVar3[0] = local_148.m_pointInWorld.m_floats[0];
            abVar3[1] = local_148.m_pointInWorld.m_floats[1];
            abVar4[0] = local_148.m_pointInWorld.m_floats[2];
            abVar4[1] = local_148.m_pointInWorld.m_floats[3];
            local_168[0] = local_148.m_pointInWorld.m_floats[0];
            local_168[1] = local_148.m_pointInWorld.m_floats[1];
            abStack_160[0] = local_148.m_pointInWorld.m_floats[2];
            abStack_160[1] = local_148.m_pointInWorld.m_floats[3];
            if (uVar8 == 0x40) {
              pp_Var5 = result->_vptr_CastResult;
              uVar7 = 0xfffffffe;
              uVar6 = 0x41;
              goto LAB_00178e60;
            }
            uVar8 = uVar8 + 1;
            fVar14 = local_148.m_distance + result->m_allowedPenetration;
            fVar9 = local_148.m_normalOnBInWorld.m_floats[0];
            fVar12 = local_148.m_normalOnBInWorld.m_floats[1];
            local_a0.m_normalOnBInWorld.m_floats[2] = local_148.m_normalOnBInWorld.m_floats[2];
            local_a0.m_normalOnBInWorld.m_floats[3] = local_148.m_normalOnBInWorld.m_floats[3];
            bVar20 = local_148.m_normalOnBInWorld.m_floats[2];
            fVar15 = timeStep;
          } while (0.001 < fVar14);
        }
        result->m_fraction = timeStep;
        (result->m_normal).m_floats[0] = local_148.m_normalOnBInWorld.m_floats[0];
        (result->m_normal).m_floats[1] = local_148.m_normalOnBInWorld.m_floats[1];
        (result->m_normal).m_floats[2] = local_a0.m_normalOnBInWorld.m_floats[2];
        (result->m_normal).m_floats[3] = local_a0.m_normalOnBInWorld.m_floats[3];
        *(btScalar (*) [2])(result->m_hitPoint).m_floats = local_168;
        *(btScalar (*) [2])((result->m_hitPoint).m_floats + 2) = abStack_160;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool	btContinuousConvexCollision::calcTimeOfImpact(
				const btTransform& fromA,
				const btTransform& toA,
				const btTransform& fromB,
				const btTransform& toB,
				CastResult& result)
{


	/// compute linear and angular velocity for this interval, to interpolate
	btVector3 linVelA,angVelA,linVelB,angVelB;
	btTransformUtil::calculateVelocity(fromA,toA,btScalar(1.),linVelA,angVelA);
	btTransformUtil::calculateVelocity(fromB,toB,btScalar(1.),linVelB,angVelB);


	btScalar boundingRadiusA = m_convexA->getAngularMotionDisc();
	btScalar boundingRadiusB = m_convexB1?m_convexB1->getAngularMotionDisc():0.f;

	btScalar maxAngularProjectedVelocity = angVelA.length() * boundingRadiusA + angVelB.length() * boundingRadiusB;
	btVector3 relLinVel = (linVelB-linVelA);

	btScalar relLinVelocLength = (linVelB-linVelA).length();
	
	if ((relLinVelocLength+maxAngularProjectedVelocity) == 0.f)
		return false;



	btScalar lambda = btScalar(0.);
	btVector3 v(1,0,0);

	int maxIter = MAX_ITERATIONS;

	btVector3 n;
	n.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
	bool hasResult = false;
	btVector3 c;

	btScalar lastLambda = lambda;
	//btScalar epsilon = btScalar(0.001);

	int numIter = 0;
	//first solution, using GJK


	btScalar radius = 0.001f;
//	result.drawCoordSystem(sphereTr);

	btPointCollector	pointCollector1;

	{
	
		computeClosestPoints(fromA,fromB,pointCollector1);

		hasResult = pointCollector1.m_hasResult;
		c = pointCollector1.m_pointInWorld;
	}

	if (hasResult)
	{
		btScalar dist;
		dist = pointCollector1.m_distance + result.m_allowedPenetration;
		n = pointCollector1.m_normalOnBInWorld;
		btScalar projectedLinearVelocity = relLinVel.dot(n);
		if ((projectedLinearVelocity+ maxAngularProjectedVelocity)<=SIMD_EPSILON)
			return false;

		//not close enough
		while (dist > radius)
		{
			if (result.m_debugDrawer)
			{
				result.m_debugDrawer->drawSphere(c,0.2f,btVector3(1,1,1));
			}
			btScalar dLambda = btScalar(0.);

			projectedLinearVelocity = relLinVel.dot(n);

			
			//don't report time of impact for motion away from the contact normal (or causes minor penetration)
			if ((projectedLinearVelocity+ maxAngularProjectedVelocity)<=SIMD_EPSILON)
				return false;
			
			dLambda = dist / (projectedLinearVelocity+ maxAngularProjectedVelocity);

			
			
			lambda = lambda + dLambda;

			if (lambda > btScalar(1.))
				return false;

			if (lambda < btScalar(0.))
				return false;


			//todo: next check with relative epsilon
			if (lambda <= lastLambda)
			{
				return false;
				//n.setValue(0,0,0);
				break;
			}
			lastLambda = lambda;

			

			//interpolate to next lambda
			btTransform interpolatedTransA,interpolatedTransB,relativeTrans;

			btTransformUtil::integrateTransform(fromA,linVelA,angVelA,lambda,interpolatedTransA);
			btTransformUtil::integrateTransform(fromB,linVelB,angVelB,lambda,interpolatedTransB);
			relativeTrans = interpolatedTransB.inverseTimes(interpolatedTransA);

			if (result.m_debugDrawer)
			{
				result.m_debugDrawer->drawSphere(interpolatedTransA.getOrigin(),0.2f,btVector3(1,0,0));
			}

			result.DebugDraw( lambda );

			btPointCollector	pointCollector;
			computeClosestPoints(interpolatedTransA,interpolatedTransB,pointCollector);

			if (pointCollector.m_hasResult)
			{
				dist = pointCollector.m_distance+result.m_allowedPenetration;
				c = pointCollector.m_pointInWorld;		
				n = pointCollector.m_normalOnBInWorld;
			} else
			{
				result.reportFailure(-1, numIter);
				return false;
			}

			numIter++;
			if (numIter > maxIter)
			{
				result.reportFailure(-2, numIter);
				return false;
			}
		}
	
		result.m_fraction = lambda;
		result.m_normal = n;
		result.m_hitPoint = c;
		return true;
	}

	return false;

}